

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool tinyxml2::XMLUtil::ToUnsigned64(char *str,uint64_t *value)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  unsigned_long_long v;
  uint64_t local_20;
  
  local_20 = 0;
  bVar1 = IsPrefixHex(str);
  pcVar3 = "%llu";
  if (bVar1) {
    pcVar3 = "%llx";
  }
  iVar2 = __isoc99_sscanf(str,pcVar3,&local_20);
  if (iVar2 == 1) {
    *value = local_20;
  }
  return iVar2 == 1;
}

Assistant:

bool XMLUtil::ToUnsigned64(const char* str, uint64_t* value) {
    unsigned long long v = 0;	// horrible syntax trick to make the compiler happy about %llu
    if(TIXML_SSCANF(str, IsPrefixHex(str) ? "%llx" : "%llu", &v) == 1) {
        *value = (uint64_t)v;
        return true;
    }
    return false;
}